

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse2.c
# Opt level: O2

void aom_dc_predictor_64x64_sse2(uint8_t *dst,ptrdiff_t stride,uint8_t *above,uint8_t *left)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined1 auVar4 [16];
  short local_38;
  short sStack_36;
  __m128i row;
  
  dc_sum_64(above);
  dc_sum_64(left);
  local_38 = (short)extraout_XMM0_Da;
  sStack_36 = (short)((uint)extraout_XMM0_Da >> 0x10);
  uVar2 = CONCAT22((short)((uint)extraout_XMM0_Da_00 >> 0x10) + sStack_36,
                   (short)extraout_XMM0_Da_00 + local_38) + 0x40;
  uVar3 = uVar2 >> 7;
  bVar1 = (byte)(uVar2 >> 0x18);
  uVar6 = (undefined1)(uVar3 >> 0x10);
  uVar5 = (undefined1)(uVar3 >> 8);
  auVar4._4_4_ = (int)(CONCAT35(CONCAT21(CONCAT11(bVar1 >> 7,bVar1 >> 7),uVar6),
                                CONCAT14(uVar6,uVar3)) >> 0x20);
  auVar4[3] = uVar5;
  auVar4[2] = uVar5;
  auVar4[0] = (undefined1)uVar3;
  auVar4[1] = auVar4[0];
  auVar4._8_8_ = 0;
  auVar4 = pshuflw(auVar4,auVar4,0);
  row[0]._0_4_ = auVar4._0_4_;
  row[0]._4_4_ = (undefined4)row[0];
  row[1]._0_4_ = (undefined4)row[0];
  row[1]._4_4_ = (undefined4)row[0];
  dc_store_64xh(&row,0x40,dst,stride);
  return;
}

Assistant:

void aom_dc_predictor_64x64_sse2(uint8_t *dst, ptrdiff_t stride,
                                 const uint8_t *above, const uint8_t *left) {
  __m128i sum_above = dc_sum_64(above);
  const __m128i sum_left = dc_sum_64(left);
  sum_above = _mm_add_epi16(sum_above, sum_left);

  uint32_t sum = (uint32_t)_mm_cvtsi128_si32(sum_above);
  sum += 64;
  sum /= 128;
  const __m128i row = _mm_set1_epi8((int8_t)sum);
  dc_store_64xh(&row, 64, dst, stride);
}